

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O3

void __thiscall
xsettingsd::SettingsManager::SettingsManager(SettingsManager *this,string *config_filename)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->config_filename_)._M_dataplus._M_p = (pointer)&(this->config_filename_).field_2;
  pcVar2 = (config_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + config_filename->_M_string_length);
  p_Var1 = &(this->settings_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->settings_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->settings_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->settings_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->settings_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->settings_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->serial_ = 0;
  this->display_ = (Display *)0x0;
  this->prop_atom_ = 0;
  (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->windows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SettingsManager::SettingsManager(const string& config_filename)
    : config_filename_(config_filename),
      serial_(0),
      display_(NULL),
      prop_atom_(None) {
}